

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_ptr.h
# Opt level: O2

void __thiscall
booster::intrusive_ptr<booster::callable<int_()>_>::~intrusive_ptr
          (intrusive_ptr<booster::callable<int_()>_> *this)

{
  if (&this->p_->super_refcounted != (refcounted *)0x0) {
    intrusive_ptr_release(&this->p_->super_refcounted);
  }
  return;
}

Assistant:

~intrusive_ptr()
    {
        if(p_ != 0) intrusive_ptr_release(p_);
    }